

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cc
# Opt level: O0

void Server::process_body(single_connection *conn)

{
  int iVar1;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  local_e0;
  char *local_a8;
  char *find_and;
  char *find_equ;
  char *ptr;
  char local_88 [4];
  int len;
  char value [32];
  uint local_5c;
  char local_58 [4];
  int value_int;
  char key [32];
  undefined1 local_30 [8];
  string key_str;
  single_connection *conn_local;
  
  key_str.field_2._8_8_ = conn;
  printf("------ REQUEST BODY PARSING START ------ \n");
  *(undefined4 *)(key_str.field_2._8_8_ + 4) = 0x10;
  if (*(int *)(key_str.field_2._8_8_ + 0x20) == *(int *)(key_str.field_2._8_8_ + 0x24)) {
    printf("[WARN] HTTP request content is empty \n");
  }
  else {
    iVar1 = strcmp((char *)(key_str.field_2._8_8_ + 0x30),"GET");
    if (iVar1 == 0) {
      printf("[WARN] Skip parsing HTTP request content \n");
    }
    else {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::clear(&post_list_abi_cxx11_);
      std::__cxx11::string::string((string *)local_30);
      find_equ = (char *)(*(long *)(key_str.field_2._8_8_ + 0x18) +
                         (long)*(int *)(key_str.field_2._8_8_ + 0x2c));
      find_and = (char *)(*(long *)(key_str.field_2._8_8_ + 0x18) +
                         (long)*(int *)(key_str.field_2._8_8_ + 0x20));
      local_a8 = (char *)(*(long *)(key_str.field_2._8_8_ + 0x18) +
                         (long)*(int *)(key_str.field_2._8_8_ + 0x20));
      while( true ) {
        memset(local_58,0,0x20);
        memset(local_88,0,0x20);
        find_and = strpbrk(find_and + 1,"=");
        if ((find_and == (char *)0x0) || ((long)find_equ - (long)find_and < 1)) break;
        local_a8 = strpbrk(local_a8 + 1,"&");
        ptr._4_4_ = ~(uint)find_and + (int)local_a8;
        strncpy(local_58,find_and + 1,(long)ptr._4_4_);
        std::__cxx11::string::operator=((string *)local_30,local_58);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&post_list_abi_cxx11_,(value_type *)local_30);
        find_and = strpbrk(find_and + 1,"=");
        local_a8 = strpbrk(local_a8 + 1,"&");
        if ((local_a8 == (char *)0x0) || ((long)find_equ - (long)local_a8 < 1)) {
          local_a8 = find_equ;
        }
        ptr._4_4_ = ~(uint)find_and + (int)local_a8;
        strncpy(local_88,find_and + 1,(long)ptr._4_4_);
        local_5c = atoi(local_88);
        printf("[INFO] Insert into the map: key = %s, value = %d \n",local_58,(ulong)local_5c);
        std::make_pair<std::__cxx11::string&,int&>
                  (&local_e0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30,
                   (int *)&local_5c);
        std::
        map<std::__cxx11::string,int,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
        ::insert<std::pair<std::__cxx11::string,int>>
                  ((map<std::__cxx11::string,int,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
                    *)&data_map_abi_cxx11_,&local_e0);
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::
        ~pair(&local_e0);
      }
      std::__cxx11::string::~string((string *)local_30);
    }
  }
  *(undefined4 *)(key_str.field_2._8_8_ + 4) = 0x20;
  *(undefined4 *)(key_str.field_2._8_8_ + 0x24) = 0;
  *(undefined4 *)(key_str.field_2._8_8_ + 0x20) = 0;
  *(code **)(*(long *)(key_str.field_2._8_8_ + 0x10) + 8) = send_response;
  *(code **)(*(long *)(key_str.field_2._8_8_ + 8) + 8) = empty_event_handler;
  Epoll_Event_Op::epoll_mod_event((single_connection *)key_str.field_2._8_8_,0xc);
  printf("------ REQUEST BODY PARSING END ------ \n");
  return;
}

Assistant:

void Server::process_body(single_connection *conn)
{
    printf("------ REQUEST BODY PARSING START ------ \n");

    /* 更新连接状态为QUERY_BODY */
    conn->state = QUERY_BODY;

    /* 判断可选消息体是否为空 */
    if (conn->query_start_index == conn->query_end_index)
    {
        printf("[WARN] HTTP request content is empty \n");
    }
    else
    {
        /* 请求方法若为GET则忽略请求体 */
        if (strcmp(conn->method, "GET") == 0)
        {
            printf("[WARN] Skip parsing HTTP request content \n");
        }
        /* 请求方法若为POST则需要解析请求体 */
        else
        {
            /* 清空post_list */
            post_list.clear();
            /* key */
            string key_str;
            char key[32];
            /* value */
            int value_int;
            char value[32];
            /* 键或值的长度 */
            int len;
            /* 可选消息体的末尾地址 */
            char *ptr = conn->querybuf + conn->data_len;
            /* find_equ定位“=”的位置 */
            char *find_equ = conn->querybuf + conn->query_start_index;
            /* find_and定位“&”的位置 */
            char *find_and = conn->querybuf + conn->query_start_index;
            while (true)
            {
                memset(key, '\0', sizeof(key));
                memset(value, '\0', sizeof(value));
                /* 定位“=”的位置 */
                find_equ = strpbrk(find_equ + 1, "=");
                /* 所找寻的“=”超出该行范围，退出循环 */
                if ((find_equ == NULL) || (ptr - find_equ <= 0))
                {
                    break;
                }
                /* 定位“&”的位置 */
                find_and = strpbrk(find_and + 1, "&");
                /* 键的长度 */
                len = find_and - find_equ - 1;
                /* 拷贝key值到key字符数组 */
                strncpy(key, find_equ + 1, len);
                key_str = key;
                /* 将键放入post_list以进行后续输出 */
                post_list.push_back(key_str);
                /* 定位“=”的位置 */
                find_equ = strpbrk(find_equ + 1, "=");
                /* 定位“&”的位置 */
                find_and = strpbrk(find_and + 1, "&");
                /* 所找寻的“=”超出该行范围，退出循环 */
                if ((find_and == NULL) || (ptr - find_and <= 0))
                {
                    find_and = ptr;
                }
                /* 值的长度 */
                len = find_and - find_equ - 1;
                /* 拷贝value值到value字符数组 */
                strncpy(value, find_equ + 1, len);
                /* value由字符数组转换为整形 */
                value_int = atoi(value);

                printf("[INFO] Insert into the map: key = %s, value = %d \n", key, value_int);

                /* 向map中插入键值对 */
                data_map.insert(make_pair(key_str, value_int));
            }
        }
    }

    /* 修改该连接状态为SEND_DATA */
    conn->state = SEND_DATA;
    /* 重置起始偏移量以及末尾指针 */
    conn->query_start_index = conn->query_end_index = 0;
    /* 设置该连接写事件回调函数为send_response */
    conn->write_event->handler = send_response;
    /* 设置该连接读事件回调函数为空 */
    conn->read_event->handler = empty_event_handler;
    /* 修改epoll事件为EPOLLOUT */
    Epoll_Event_Op::epoll_mod_event(conn, EPOLLOUT | EPOLLERR);

    printf("------ REQUEST BODY PARSING END ------ \n");
}